

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::core::Engine::Close(Engine *this,int transportIndex)

{
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *hint;
  Comm *this_00;
  Comm local_50 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  (**(code **)(*(long *)in_RDI + 0x420))(in_RDI,in_ESI);
  in_RDI[4]._M_dataplus = (_Alloc_hider)0x0;
  if (in_ESI == -1) {
    hint = (string *)((long)&in_RDI[2].field_2 + 8);
    this_00 = local_50;
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::operator+(in_RDI,(char *)this_00);
    helper::Comm::Free(this_00,hint);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)local_50);
    in_RDI[3].field_2._M_local_buf[4] = '\x01';
  }
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    DoClose(transportIndex);

    m_IsOpen = false;

    if (transportIndex == -1)
    {
        m_Comm.Free("freeing comm in Engine " + m_Name + ", in call to Close");
        m_IsClosed = true;
    }
}